

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_thread.cpp
# Opt level: O0

void mpp_sthd_put(MppSThd thd)

{
  MppSThdImpl *impl;
  MppSThd thd_local;
  
  if ((thd == (MppSThd)0x0) &&
     (_mpp_log_l(2,"mpp_thread","Assertion %s failed at %s:%d\n",(char *)0x0,"impl","mpp_sthd_put",
                 0x120), (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  if ((*(MppSThd *)((long)thd + 0x78) != thd) &&
     (_mpp_log_l(2,"mpp_thread","Assertion %s failed at %s:%d\n",(char *)0x0,"impl->ctx.thd == impl"
                 ,"mpp_sthd_put",0x121), (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  if (((*(int *)((long)thd + 0x10) != 0) && (*(int *)((long)thd + 0x10) != 1)) &&
     (_mpp_log_l(2,"mpp_thread","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "impl->status == MPP_STHD_UNINITED || impl->status == MPP_STHD_READY",
                 "mpp_sthd_put",0x122), (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  mpp_sthd_deinit((MppSThdImpl *)thd);
  mpp_osal_free("mpp_sthd_put",thd);
  return;
}

Assistant:

void mpp_sthd_put(MppSThd thd)
{
    MppSThdImpl *impl = (MppSThdImpl *)thd;

    mpp_assert(impl);
    mpp_assert(impl->ctx.thd == impl);
    mpp_assert(impl->status == MPP_STHD_UNINITED || impl->status == MPP_STHD_READY);

    mpp_sthd_deinit(impl);

    mpp_free(impl);
}